

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O0

DWORD SetFilePointer(HANDLE hFile,LONG lDistanceToMove,PLONG lpDistanceToMoveHigh,DWORD dwMoveMethod
                    )

{
  DWORD local_34;
  CPalThread *pCStack_30;
  LONG lNewFilePointerLow;
  CPalThread *pThread;
  PAL_ERROR palError;
  DWORD dwMoveMethod_local;
  PLONG lpDistanceToMoveHigh_local;
  HANDLE pVStack_10;
  LONG lDistanceToMove_local;
  HANDLE hFile_local;
  
  pThread._0_4_ = 0;
  local_34 = 0;
  pThread._4_4_ = dwMoveMethod;
  _palError = lpDistanceToMoveHigh;
  lpDistanceToMoveHigh_local._4_4_ = lDistanceToMove;
  pVStack_10 = hFile;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pCStack_30 = CorUnix::InternalGetCurrentThread();
  pThread._0_4_ =
       CorUnix::InternalSetFilePointer
                 (pCStack_30,pVStack_10,lpDistanceToMoveHigh_local._4_4_,_palError,pThread._4_4_,
                  (PLONG)&local_34);
  if ((PAL_ERROR)pThread != 0) {
    local_34 = 0xffffffff;
  }
  CorUnix::CPalThread::SetLastError((PAL_ERROR)pThread);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return local_34;
}

Assistant:

DWORD
PALAPI
SetFilePointer(
           IN HANDLE hFile,
           IN LONG lDistanceToMove,
           IN PLONG lpDistanceToMoveHigh,
           IN DWORD dwMoveMethod)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread;
    LONG lNewFilePointerLow = 0;

    PERF_ENTRY(SetFilePointer);
    ENTRY("SetFilePointer(hFile=%p, lDistance=%d, lpDistanceHigh=%p, "
          "dwMoveMethod=%#x)\n", hFile, lDistanceToMove,
          lpDistanceToMoveHigh, dwMoveMethod);

    pThread = InternalGetCurrentThread();

    palError = InternalSetFilePointer(
        pThread,
        hFile,
        lDistanceToMove,
        lpDistanceToMoveHigh,
        dwMoveMethod,
        &lNewFilePointerLow
        );

    if (NO_ERROR != palError)
    {
        lNewFilePointerLow = INVALID_SET_FILE_POINTER;
    }

    /* This function must always call SetLastError - even if successful. 
       If we seek to a value greater than 2^32 - 1, we will effectively be
       returning a negative value from this function. Now, let's say that
       returned value is -1. Furthermore, assume that win32error has been 
       set before even entering this function. Then, when this function 
       returns to SetFilePointer in win32native.cs, it will have returned 
       -1 and win32error will have been set, which will cause an error to be
       returned. Since -1 may not be an error in this case and since we 
       can't assume that the win32error is related to SetFilePointer, 
       we need to always call SetLastError here. That way, if this function 
       succeeds, SetFilePointer in win32native won't mistakenly determine 
       that it failed. */
    pThread->SetLastError(palError);
    
    LOGEXIT("SetFilePointer returns DWORD %#x\n", lNewFilePointerLow);
    PERF_EXIT(SetFilePointer);
    return lNewFilePointerLow;
}